

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O0

void duckdb::ValidityRevertAppend(ColumnSegment *segment,idx_t start_row)

{
  data_ptr_t pdVar1;
  BufferHandle *this;
  long in_RSI;
  ColumnSegment *in_RDI;
  idx_t i;
  ValidityMask mask;
  idx_t bit_end;
  idx_t byte_pos;
  idx_t revert_start;
  BufferHandle handle;
  BufferManager *buffer_manager;
  idx_t start_bit;
  validity_t *in_stack_ffffffffffffff58;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff60;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff68;
  ulong local_88;
  ulong local_40;
  undefined1 local_38 [24];
  BufferManager *local_20;
  ulong local_18;
  ColumnSegment *local_8;
  
  local_18 = in_RSI - (in_RDI->super_SegmentBase<duckdb::ColumnSegment>).start;
  local_8 = in_RDI;
  local_20 = BufferManager::GetBufferManager((DatabaseInstance *)0xa1ac53);
  (*local_20->_vptr_BufferManager[7])(local_38,local_20,&local_8->block);
  local_40 = local_18;
  if ((local_18 & 7) != 0) {
    local_40 = (local_18 & 0xfffffffffffffff8) + 8;
    BufferHandle::Ptr((BufferHandle *)0xa1acc0);
    ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68);
    ValidityMask::ValidityMask
              ((ValidityMask *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0xa1acea);
    for (local_88 = local_18; local_88 < local_40; local_88 = local_88 + 1) {
      TemplatedValidityMask<unsigned_long>::SetValid
                (in_stack_ffffffffffffff60,(idx_t)in_stack_ffffffffffffff58);
    }
    ValidityMask::~ValidityMask((ValidityMask *)0xa1ad70);
  }
  local_40 = local_40 >> 3;
  pdVar1 = BufferHandle::Ptr((BufferHandle *)0xa1ad8d);
  pdVar1 = pdVar1 + local_40;
  this = (BufferHandle *)ColumnSegment::SegmentSize(local_8);
  memset(pdVar1,0xff,(long)this - local_40);
  BufferHandle::~BufferHandle(this);
  return;
}

Assistant:

void ValidityRevertAppend(ColumnSegment &segment, idx_t start_row) {
	idx_t start_bit = start_row - segment.start;

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	idx_t revert_start;
	if (start_bit % 8 != 0) {
		// handle sub-bit stuff (yay)
		idx_t byte_pos = start_bit / 8;
		idx_t bit_end = (byte_pos + 1) * 8;
		ValidityMask mask(reinterpret_cast<validity_t *>(handle.Ptr()), segment.count);
		for (idx_t i = start_bit; i < bit_end; i++) {
			mask.SetValid(i);
		}
		revert_start = bit_end / 8;
	} else {
		revert_start = start_bit / 8;
	}
	// for the rest, we just memset
	memset(handle.Ptr() + revert_start, 0xFF, segment.SegmentSize() - revert_start);
}